

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int VLin2VectorArray_Serial(int nvec,realtype a,N_Vector *X,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_RAX;
  long lVar4;
  ulong uVar5;
  
  if (0 < nvec) {
    in_RAX = *(*X)->content;
    uVar5 = 0;
    do {
      if (0 < in_RAX) {
        lVar1 = *(long *)((long)X[uVar5]->content + 0x10);
        lVar2 = *(long *)((long)Y[uVar5]->content + 0x10);
        lVar3 = *(long *)((long)Z[uVar5]->content + 0x10);
        lVar4 = 0;
        do {
          *(double *)(lVar3 + lVar4 * 8) =
               *(double *)(lVar1 + lVar4 * 8) * a - *(double *)(lVar2 + lVar4 * 8);
          lVar4 = lVar4 + 1;
        } while (in_RAX != lVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nvec);
  }
  return (int)in_RAX;
}

Assistant:

static int VLin2VectorArray_Serial(int nvec, realtype a, N_Vector* X, N_Vector* Y, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  N = NV_LENGTH_S(X[0]);

  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++)
      zd[j] = (a * xd[j]) - yd[j];
  }

  return(0);
}